

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_QuickSort3(word *pData,int nSize,int fDecrease)

{
  word *pwVar1;
  long lVar2;
  long lVar3;
  
  if (fDecrease == 0) {
    Abc_QuickSort2Inc_rec(pData,0,nSize + -1);
    lVar3 = 1;
    while (lVar3 < nSize) {
      lVar2 = lVar3 + -1;
      pwVar1 = pData + lVar3;
      lVar3 = lVar3 + 1;
      if ((uint)*pwVar1 < (uint)pData[lVar2]) {
        __assert_fail("(unsigned)pData[i-1] <= (unsigned)pData[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                      ,0x2b7,"void Abc_QuickSort3(word *, int, int)");
      }
    }
  }
  else {
    Abc_QuickSort2Dec_rec(pData,0,nSize + -1);
    lVar3 = 1;
    while (lVar3 < nSize) {
      lVar2 = lVar3 + -1;
      pwVar1 = pData + lVar3;
      lVar3 = lVar3 + 1;
      if ((uint)pData[lVar2] < (uint)*pwVar1) {
        __assert_fail("(unsigned)pData[i-1] >= (unsigned)pData[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                      ,0x2b0,"void Abc_QuickSort3(word *, int, int)");
      }
    }
  }
  return;
}

Assistant:

void Abc_QuickSort3( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 1;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}